

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
 testing::internal::
 ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
           (const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            begin,const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  end,int *elem)

{
  bool bVar1;
  const_reference piVar2;
  ulong uVar3;
  ulong uVar4;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar5;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar6;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar7;
  ulong uVar8;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar9;
  
  uVar3 = end.pos;
  psVar5 = end.table;
  psVar7 = begin.table;
  uVar4 = uVar3;
  psVar6 = psVar5;
  if (begin.pos != uVar3 || ((ulong)psVar7 ^ (ulong)psVar5) != 0) {
    uVar8 = begin.pos;
    do {
      piVar2 = google::
               sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::get
                         ((psVar7->groups).
                          super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8 / 0x30,
                          (short)uVar8 + (short)(uVar8 / 0x30) * -0x30);
      uVar4 = uVar8;
      psVar6 = psVar7;
      if (*piVar2 == *elem) break;
      bVar1 = uVar3 - 1 != uVar8;
      uVar4 = uVar3;
      psVar6 = psVar5;
      uVar8 = uVar8 + 1;
    } while (bVar1 || ((ulong)psVar7 ^ (ulong)psVar5) != 0);
  }
  cVar9.pos = uVar4;
  cVar9.table = psVar6;
  return cVar9;
}

Assistant:

Iter ArrayAwareFind(Iter begin, Iter end, const Element& elem) {
  for (Iter it = begin; it != end; ++it) {
    if (internal::ArrayEq(*it, elem)) return it;
  }
  return end;
}